

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

QModelIndexList * __thiscall
QAbstractItemViewPrivate::selectedDraggableIndexes
          (QModelIndexList *__return_storage_ptr__,QAbstractItemViewPrivate *this)

{
  long *plVar1;
  long lVar2;
  quintptr qVar3;
  int iVar4;
  ulong uVar5;
  iterator aend;
  iterator iVar6;
  long lVar7;
  long lVar8;
  const_iterator abegin;
  QModelIndex *pQVar9;
  QModelIndex *pQVar10;
  QModelIndex *pQVar11;
  
  plVar1 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
  (**(code **)(*plVar1 + 0x2d8))();
  pQVar10 = (__return_storage_ptr__->d).ptr;
  lVar2 = (__return_storage_ptr__->d).size;
  lVar8 = lVar2 * 0x18;
  pQVar11 = pQVar10;
  for (lVar7 = lVar2 >> 2; pQVar9 = pQVar11, 0 < lVar7; lVar7 = lVar7 + -1) {
    uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar11);
    if ((uVar5 & 4) == 0) goto LAB_004e34e1;
    uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar11 + 1);
    pQVar9 = pQVar11 + 1;
    if ((uVar5 & 4) == 0) goto LAB_004e34e1;
    uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar11 + 2);
    pQVar9 = pQVar11 + 2;
    if ((uVar5 & 4) == 0) goto LAB_004e34e1;
    uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar11 + 3);
    pQVar9 = pQVar11 + 3;
    if ((uVar5 & 4) == 0) goto LAB_004e34e1;
    pQVar11 = pQVar11 + 4;
    lVar8 = lVar8 + -0x60;
  }
  lVar7 = lVar8 / 0x18;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pQVar9 = pQVar10 + lVar2;
      if ((lVar7 != 3) ||
         (uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar11,lVar8 % 0x18),
         pQVar9 = pQVar11, (uVar5 & 4) == 0)) goto LAB_004e34e1;
      pQVar9 = pQVar11 + 1;
    }
    uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar9);
    if ((uVar5 & 4) == 0) goto LAB_004e34e1;
    pQVar11 = pQVar9 + 1;
  }
  uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar11);
  pQVar9 = pQVar10 + lVar2;
  if ((uVar5 & 4) == 0) {
    pQVar9 = pQVar11;
  }
LAB_004e34e1:
  if (((long)pQVar9 - (long)pQVar10) / 0x18 != (__return_storage_ptr__->d).size) {
    aend = QList<QModelIndex>::end(__return_storage_ptr__);
    iVar6 = QList<QModelIndex>::begin(__return_storage_ptr__);
    abegin.i = iVar6.i + ((long)pQVar9 - (long)pQVar10);
    pQVar10 = abegin.i;
    while (pQVar11 = pQVar10, pQVar10 = pQVar11 + 1, pQVar10 != aend.i) {
      uVar5 = (**(code **)(*(long *)this->model + 0x138))(this->model,pQVar10);
      if ((uVar5 & 4) != 0) {
        ((abegin.i)->m).ptr = pQVar11[1].m.ptr;
        iVar4 = pQVar10->c;
        qVar3 = pQVar11[1].i;
        (abegin.i)->r = pQVar10->r;
        (abegin.i)->c = iVar4;
        (abegin.i)->i = qVar3;
        abegin.i = abegin.i + 1;
      }
    }
    QList<QModelIndex>::erase(__return_storage_ptr__,abegin,(const_iterator)aend.i);
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndexList QAbstractItemViewPrivate::selectedDraggableIndexes() const
{
    Q_Q(const QAbstractItemView);
    QModelIndexList indexes = q->selectedIndexes();
    auto isNotDragEnabled = [this](const QModelIndex &index) {
        return !isIndexDragEnabled(index);
    };
    indexes.removeIf(isNotDragEnabled);
    return indexes;
}